

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniDFS.cpp
# Opt level: O2

void __thiscall DataServer::operator()(DataServer *this)

{
  __mode_t __mode;
  unique_lock<std::mutex> *__path;
  reference rVar1;
  unique_lock<std::mutex> lk;
  unique_lock<std::mutex> local_40;
  
  do {
    std::unique_lock<std::mutex>::unique_lock(&local_40,&nd_m);
    __path = &local_40;
    std::condition_variable::operator()
              ((condition_variable *)nd_cv,&local_40,(anon_class_8_1_8991fb9c)this);
    if (ispropercmd == true) {
      switch(type) {
      case put:
      case put2:
        saveFile(this);
        break;
      case read:
      case read2:
        if ((is_ready_read == true) && (server_executing_read == this->serverId)) {
          readFileAndOutput(this);
        }
        break;
      case mkdir:
        mkdir(this,(char *)__path,__mode);
      }
    }
    rVar1 = std::vector<bool,_std::allocator<bool>_>::operator[](&dataNotified,(long)this->serverId)
    ;
    *rVar1._M_p = *rVar1._M_p & ~rVar1._M_mask;
    std::unique_lock<std::mutex>::unlock(&local_40);
    std::condition_variable::notify_all();
    std::unique_lock<std::mutex>::~unique_lock(&local_40);
  } while( true );
}

Assistant:

void operator() () const
    {
        for (;;)
        {
            unique_lock<mutex> lk(nd_m);
            nd_cv.wait(lk, [this]{return dataNotified[serverId];});

            if (ispropercmd && (type == MsgType::put || type == MsgType::put2))
            {
                saveFile();
            }
            else if (ispropercmd && (type == MsgType::read || type == MsgType::read2)){

                if (is_ready_read && server_executing_read == serverId)
                {
                    //cout << "is ready read and my id is " << serverId << endl;
                    readFileAndOutput();
                }
            }
            else if (ispropercmd && type == MsgType::mkdir)
            {
                mkdir();
            }
            //cout << serverId << " data notified \n";
            dataNotified[serverId] = false;
            lk.unlock();
            nd_cv.notify_all();
        }

    }